

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerStress(void *p,PgHdr *pPg)

{
  int iVar1;
  uint uVar2;
  Pager *pPager;
  
  if (*(int *)((long)p + 0x2c) != 0) {
    return 0;
  }
  if (*(char *)((long)p + 0x17) != '\0') {
    return 0;
  }
  if ((*(char *)((long)p + 0x18) != '\0') && ((pPg->flags & 4) != 0)) {
    return 0;
  }
  pPg->pDirty = (PgHdr *)0x0;
  if (*(long *)((long)p + 0x118) == 0) {
    if (((((pPg->flags & 4) != 0) || (*(char *)((long)p + 0x13) == '\x03')) &&
        (uVar2 = syncJournal((Pager *)p,1), uVar2 != 0)) ||
       (((*(uint *)((long)p + 0x1c) < pPg->pgno && (iVar1 = subjRequiresPage(pPg), iVar1 != 0)) &&
        (uVar2 = subjournalPage(pPg), uVar2 != 0)))) goto LAB_00125b0c;
    uVar2 = pager_write_pagelist((Pager *)p,pPg);
  }
  else {
    iVar1 = subjRequiresPage(pPg);
    if ((iVar1 != 0) && (uVar2 = subjournalPage(pPg), uVar2 != 0)) goto LAB_00125b0c;
    uVar2 = pagerWalFrames((Pager *)p,pPg,0,0);
  }
  if (uVar2 == 0) {
    sqlite3PcacheMakeClean(pPg);
    return 0;
  }
LAB_00125b0c:
  if (((char)uVar2 == '\r') || ((uVar2 & 0xff) == 10)) {
    *(uint *)((long)p + 0x2c) = uVar2;
    *(undefined1 *)((long)p + 0x13) = 6;
  }
  return uVar2;
}

Assistant:

static int pagerStress(void *p, PgHdr *pPg){
  Pager *pPager = (Pager *)p;
  int rc = SQLITE_OK;

  assert( pPg->pPager==pPager );
  assert( pPg->flags&PGHDR_DIRTY );

  /* The doNotSyncSpill flag is set during times when doing a sync of
  ** journal (and adding a new header) is not allowed.  This occurs
  ** during calls to sqlite3PagerWrite() while trying to journal multiple
  ** pages belonging to the same sector.
  **
  ** The doNotSpill flag inhibits all cache spilling regardless of whether
  ** or not a sync is required.  This is set during a rollback.
  **
  ** Spilling is also prohibited when in an error state since that could
  ** lead to database corruption.   In the current implementaton it 
  ** is impossible for sqlite3PcacheFetch() to be called with createFlag==1
  ** while in the error state, hence it is impossible for this routine to
  ** be called in the error state.  Nevertheless, we include a NEVER()
  ** test for the error state as a safeguard against future changes.
  */
  if( NEVER(pPager->errCode) ) return SQLITE_OK;
  if( pPager->doNotSpill ) return SQLITE_OK;
  if( pPager->doNotSyncSpill && (pPg->flags & PGHDR_NEED_SYNC)!=0 ){
    return SQLITE_OK;
  }

  pPg->pDirty = 0;
  if( pagerUseWal(pPager) ){
    /* Write a single frame for this page to the log. */
    if( subjRequiresPage(pPg) ){ 
      rc = subjournalPage(pPg); 
    }
    if( rc==SQLITE_OK ){
      rc = pagerWalFrames(pPager, pPg, 0, 0);
    }
  }else{
  
    /* Sync the journal file if required. */
    if( pPg->flags&PGHDR_NEED_SYNC 
     || pPager->eState==PAGER_WRITER_CACHEMOD
    ){
      rc = syncJournal(pPager, 1);
    }
  
    /* If the page number of this page is larger than the current size of
    ** the database image, it may need to be written to the sub-journal.
    ** This is because the call to pager_write_pagelist() below will not
    ** actually write data to the file in this case.
    **
    ** Consider the following sequence of events:
    **
    **   BEGIN;
    **     <journal page X>
    **     <modify page X>
    **     SAVEPOINT sp;
    **       <shrink database file to Y pages>
    **       pagerStress(page X)
    **     ROLLBACK TO sp;
    **
    ** If (X>Y), then when pagerStress is called page X will not be written
    ** out to the database file, but will be dropped from the cache. Then,
    ** following the "ROLLBACK TO sp" statement, reading page X will read
    ** data from the database file. This will be the copy of page X as it
    ** was when the transaction started, not as it was when "SAVEPOINT sp"
    ** was executed.
    **
    ** The solution is to write the current data for page X into the 
    ** sub-journal file now (if it is not already there), so that it will
    ** be restored to its current value when the "ROLLBACK TO sp" is 
    ** executed.
    */
    if( NEVER(
        rc==SQLITE_OK && pPg->pgno>pPager->dbSize && subjRequiresPage(pPg)
    ) ){
      rc = subjournalPage(pPg);
    }
  
    /* Write the contents of the page out to the database file. */
    if( rc==SQLITE_OK ){
      assert( (pPg->flags&PGHDR_NEED_SYNC)==0 );
      rc = pager_write_pagelist(pPager, pPg);
    }
  }

  /* Mark the page as clean. */
  if( rc==SQLITE_OK ){
    PAGERTRACE(("STRESS %d page %d\n", PAGERID(pPager), pPg->pgno));
    sqlite3PcacheMakeClean(pPg);
  }

  return pager_error(pPager, rc); 
}